

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 HashmapCurrentValue(jx9_context *pCtx,jx9_hashmap *pMap,int iDirection)

{
  jx9_vm *pjVar1;
  sxi32 sVar2;
  uint uVar3;
  jx9_hashmap_node *pjVar4;
  jx9_value *pSrc;
  jx9_value *pObj;
  
  pjVar4 = pMap->pCur;
  if (pjVar4 == (jx9_hashmap_node *)0x0) {
LAB_0013a718:
    pObj = pCtx->pRet;
  }
  else {
    if (iDirection != 0) {
      pjVar4 = (&pjVar4->pNext)[0 < iDirection];
      pMap->pCur = pjVar4;
      if (pjVar4 == (jx9_hashmap_node *)0x0) goto LAB_0013a718;
    }
    pjVar1 = pjVar4->pMap->pVm;
    if (pjVar4->nValIdx < (pjVar1->aMemObj).nUsed) {
      pSrc = (jx9_value *)
             ((ulong)(pjVar4->nValIdx * (pjVar1->aMemObj).eSize) + (long)(pjVar1->aMemObj).pBase);
    }
    else {
      pSrc = (jx9_value *)0x0;
    }
    pObj = pCtx->pRet;
    if (pSrc != (jx9_value *)0x0) {
      sVar2 = jx9MemObjStore(pSrc,pObj);
      return sVar2;
    }
  }
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  uVar3 = pObj->iFlags & 0xfffffe90U | 8;
  pObj->iFlags = uVar3;
  return uVar3;
}

Assistant:

static sxi32 HashmapCurrentValue(jx9_context *pCtx, jx9_hashmap *pMap, int iDirection)
{
	jx9_hashmap_node *pCur = pMap->pCur;
	jx9_value *pVal;
	if( pCur == 0 ){
		/* Cursor does not point to anything, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( iDirection != 0 ){
		if( iDirection > 0 ){
			/* Point to the next entry */
			pMap->pCur = pCur->pPrev; /* Reverse link */
			pCur = pMap->pCur;
		}else{
			/* Point to the previous entry */
			pMap->pCur = pCur->pNext; /* Reverse link */
			pCur = pMap->pCur;
		}
		if( pCur == 0 ){
			/* End of input reached, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
	}		
	/* Point to the desired element */
	pVal = HashmapExtractNodeValue(pCur);
	if( pVal ){
		jx9_result_value(pCtx, pVal);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}